

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O1

void WebRtcSpl_ScaleVector
               (int16_t *in_vector,int16_t *out_vector,int16_t gain,size_t in_vector_length,
               int16_t right_shifts)

{
  int16_t *outptr;
  int16_t *inptr;
  size_t sVar1;
  
  if (in_vector_length != 0) {
    sVar1 = 0;
    do {
      out_vector[sVar1] =
           (int16_t)((int)in_vector[sVar1] * (int)gain >> ((byte)right_shifts & 0x1f));
      sVar1 = sVar1 + 1;
    } while (in_vector_length != sVar1);
  }
  return;
}

Assistant:

void WebRtcSpl_ScaleVector(const int16_t *in_vector, int16_t *out_vector,
                           int16_t gain, size_t in_vector_length,
                           int16_t right_shifts)
{
    // Performs vector operation: out_vector = (gain*in_vector)>>right_shifts
    size_t i;
    const int16_t *inptr;
    int16_t *outptr;

    inptr = in_vector;
    outptr = out_vector;

    for (i = 0; i < in_vector_length; i++)
    {
      *outptr++ = (int16_t)((*inptr++ * gain) >> right_shifts);
    }
}